

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::TableRemove(ImGuiTable *table)

{
  ImPoolIdx i;
  float *pfVar1;
  ImGuiTable *in_RDI;
  int table_idx;
  ImPool<ImGuiTable> *unaff_retaddr;
  ImGuiContext *g;
  ImGuiContext *p;
  
  p = GImGui;
  i = ImPool<ImGuiTable>::GetIndex(&GImGui->Tables,in_RDI);
  ImPool<ImGuiTable>::Remove(unaff_retaddr,(ImGuiID)((ulong)in_RDI >> 0x20),(ImGuiTable *)p);
  pfVar1 = ImVector<float>::operator[](&p->TablesLastTimeActive,i);
  *pfVar1 = -1.0;
  return;
}

Assistant:

void ImGui::TableRemove(ImGuiTable* table)
{
    //IMGUI_DEBUG_LOG("TableRemove() id=0x%08X\n", table->ID);
    ImGuiContext& g = *GImGui;
    int table_idx = g.Tables.GetIndex(table);
    //memset(table->RawData.Data, 0, table->RawData.size_in_bytes());
    //memset(table, 0, sizeof(ImGuiTable));
    g.Tables.Remove(table->ID, table);
    g.TablesLastTimeActive[table_idx] = -1.0f;
}